

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O1

void dummy_CheckIfPolyTypeIsEquivalentForFixedField(void)

{
  return;
}

Assistant:

bool JavascriptNativeOperators::CheckIfTypeIsEquivalent(Type* type, JitEquivalentTypeGuard* guard)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(CheckIfTypeIsEquivalent, reentrancylock, type->GetScriptContext()->GetThreadContext());
        bool result = EquivalenceCheckHelper(type, guard, guard->GetValue());
        if (result)
        {
            guard->SetTypeAddr((intptr_t)type);
        }
        return result;
        JIT_HELPER_END(CheckIfTypeIsEquivalent);
    }